

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client_link.cpp
# Opt level: O2

void __thiscall miniros::ServiceClientLink::ServiceClientLink(ServiceClientLink *this)

{
  DropWatcher *pDVar1;
  DropWatcher *pDVar2;
  DropWatcher *local_20;
  
  (this->super_enable_shared_from_this<miniros::ServiceClientLink>)._M_weak_this.
  super___weak_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<miniros::ServiceClientLink>)._M_weak_this.
  super___weak_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_ServiceClientLink = (_func_int **)&PTR__ServiceClientLink_002f1448;
  (this->drop_watcher_)._M_t.
  super___uniq_ptr_impl<miniros::ServiceClientLink::DropWatcher,_std::default_delete<miniros::ServiceClientLink::DropWatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_miniros::ServiceClientLink::DropWatcher_*,_std::default_delete<miniros::ServiceClientLink::DropWatcher>_>
  .super__Head_base<0UL,_miniros::ServiceClientLink::DropWatcher_*,_false>._M_head_impl =
       (DropWatcher *)0x0;
  (this->connection_).super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->connection_).super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->parent_).super___weak_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->parent_).super___weak_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->persistent_ = false;
  std::make_unique<miniros::ServiceClientLink::DropWatcher,miniros::ServiceClientLink&>
            ((ServiceClientLink *)&stack0xffffffffffffffe0);
  pDVar2 = local_20;
  local_20 = (DropWatcher *)0x0;
  pDVar1 = (this->drop_watcher_)._M_t.
           super___uniq_ptr_impl<miniros::ServiceClientLink::DropWatcher,_std::default_delete<miniros::ServiceClientLink::DropWatcher>_>
           ._M_t.
           super__Tuple_impl<0UL,_miniros::ServiceClientLink::DropWatcher_*,_std::default_delete<miniros::ServiceClientLink::DropWatcher>_>
           .super__Head_base<0UL,_miniros::ServiceClientLink::DropWatcher_*,_false>._M_head_impl;
  (this->drop_watcher_)._M_t.
  super___uniq_ptr_impl<miniros::ServiceClientLink::DropWatcher,_std::default_delete<miniros::ServiceClientLink::DropWatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_miniros::ServiceClientLink::DropWatcher_*,_std::default_delete<miniros::ServiceClientLink::DropWatcher>_>
  .super__Head_base<0UL,_miniros::ServiceClientLink::DropWatcher_*,_false>._M_head_impl = pDVar2;
  if (pDVar1 != (DropWatcher *)0x0) {
    (**(code **)(*(long *)&(pDVar1->super_DropWatcher).super_Connection + 8))();
    if (local_20 != (DropWatcher *)0x0) {
      (**(code **)(*(_func_int **)local_20 + 8))();
    }
  }
  return;
}

Assistant:

ServiceClientLink::ServiceClientLink()
: persistent_(false)
{
    drop_watcher_ = std::make_unique<DropWatcher>(*this);
}